

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O2

uint32_t helper_atomic_cmpxchgb_s390x
                   (CPUArchState_conflict29 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  byte bVar1;
  byte *pbVar2;
  uintptr_t unaff_retaddr;
  
  pbVar2 = (byte *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  LOCK();
  bVar1 = *pbVar2;
  if ((byte)cmpv == bVar1) {
    *pbVar2 = (byte)newv;
    bVar1 = (byte)cmpv;
  }
  UNLOCK();
  return (uint32_t)bVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}